

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O2

VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>
Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::getEmpty(void)

{
  int *piVar1;
  VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> VVar2;
  int iVar3;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *in_RDI;
  
  if (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::getEmpty()::inst == '\0') {
    iVar3 = __cxa_guard_acquire(&VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::
                                 getEmpty()::inst);
    if (iVar3 != 0) {
      getEmpty::inst._core =
           (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)
           EmptyIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::operator_new(0x10);
      (getEmpty::inst._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_009efc10;
      (getEmpty::inst._core)->_refCnt = 1;
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::
                           getEmpty()::inst);
    }
  }
  VVar2._core = getEmpty::inst._core;
  in_RDI->_vptr_IteratorCore = (_func_int **)getEmpty::inst._core;
  if (VVar2._core != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0) {
    piVar1 = &(VVar2._core)->_refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }